

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

void crnlib::LenPriceEnc_UpdateTable(CLenPriceEnc *p,UInt32 posState,UInt32 *ProbPrices)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar11 = p->tableSize;
  uVar5 = (ulong)uVar11;
  uVar6 = (p->p).choice >> 2 & 0xfffffffc;
  iVar10 = *(int *)((long)ProbPrices + (ulong)uVar6);
  iVar1 = *(int *)((long)ProbPrices + (ulong)(uVar6 ^ 0x1fc));
  uVar6 = (p->p).choice2 >> 2 & 0xfffffffc;
  iVar2 = *(int *)((long)ProbPrices + (ulong)uVar6);
  iVar3 = *(int *)((long)ProbPrices + (ulong)(uVar6 ^ 0x1fc));
  uVar6 = 7;
  if (uVar11 < 7) {
    uVar6 = uVar11;
  }
  uVar6 = 0x10 - uVar6;
  uVar12 = 7;
  if (uVar5 < 7) {
    uVar12 = uVar5;
  }
  uVar12 = uVar12 + 1;
  uVar4 = 0;
  do {
    uVar13 = uVar4;
    if (uVar13 == uVar5) goto LAB_00198710;
    uVar14 = (ulong)uVar6;
    iVar9 = 0;
    uVar8 = (uint)uVar13 | 8;
    do {
      uVar7 = uVar8 >> 1;
      iVar9 = iVar9 + ProbPrices
                      [(-(uVar8 & 1) & 0x7f0 ^
                       (uint)*(ushort *)
                              ((long)(p->p).low +
                              (ulong)(uVar8 & 0xfffffffe) + (ulong)(posState << 3) * 2)) >> 4];
      uVar8 = uVar7;
    } while (uVar7 != 1);
    p->prices[posState][uVar13] = iVar9 + iVar10;
    uVar6 = uVar6 + 1;
    uVar4 = uVar13 + 1;
  } while (uVar13 + 1 != 8);
  uVar6 = 8;
  if (uVar13 < 0xf) {
    do {
      if (uVar5 <= uVar12) goto LAB_00198710;
      iVar10 = 0;
      uVar6 = (int)uVar12 - 8U | 8;
      do {
        uVar8 = uVar6 >> 1;
        iVar10 = iVar10 + ProbPrices
                          [(-(uVar6 & 1) & 0x7f0 ^
                           (uint)*(ushort *)
                                  ((long)(p->p).mid +
                                  (ulong)(uVar6 & 0xfffffffe) + (ulong)(posState << 3) * 2)) >> 4];
        uVar6 = uVar8;
      } while (uVar8 != 1);
      p->prices[posState][uVar12] = iVar10 + iVar2 + iVar1;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
    uVar6 = (uint)uVar12;
  }
  if (uVar6 < uVar11) {
    uVar12 = (ulong)uVar6;
    do {
      iVar10 = 0;
      uVar11 = (int)uVar12 - 0x10U | 0x100;
      do {
        uVar6 = uVar11 >> 1;
        iVar10 = iVar10 + ProbPrices
                          [(-(uVar11 & 1) & 0x7f0 ^
                           (uint)*(ushort *)((long)(p->p).high + (ulong)(uVar11 & 0xfffffffe))) >> 4
                          ];
        uVar11 = uVar6;
      } while (uVar6 != 1);
      p->prices[posState][uVar12] = iVar10 + iVar1 + iVar3;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar5);
  }
LAB_00198710:
  p->counters[posState] = p->tableSize;
  return;
}

Assistant:

static void MY_FAST_CALL LenPriceEnc_UpdateTable(CLenPriceEnc* p, UInt32 posState, UInt32* ProbPrices) {
  LenEnc_SetPrices(&p->p, posState, p->tableSize, p->prices[posState], ProbPrices);
  p->counters[posState] = p->tableSize;
}